

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O2

void hide_ship(Am_Object *ship_obj)

{
  Am_Value *this;
  bool bVar1;
  Am_Object *this_00;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Object local_28;
  
  this_00 = &AStack_38;
  this = (Am_Value *)Am_Object::Get((ushort)ship_obj,0x69);
  bVar1 = Am_Value::operator_cast_to_bool(this);
  Am_Object::Set((ushort)ship_obj,true,(ulong)!bVar1);
  Am_Object::Am_Object(&local_28,ship_obj);
  hide_tractor_beams(&local_28,!bVar1);
  Am_Object::~Am_Object(&local_28);
  if (bVar1) {
    Am_Object::Am_Object(&AStack_38,ship_obj);
    Am_Object::Remove_Part((Am_Object)0x10e3f0);
  }
  else {
    this_00 = &local_30;
    Am_Object::Am_Object(this_00,ship_obj);
    Am_Object::Add_Part((Am_Object)0x10e3f0,SUB81(this_00,0),1);
  }
  Am_Object::~Am_Object(this_00);
  return;
}

Assistant:

void
hide_ship(Am_Object ship_obj)
{
  bool new_vis = !(bool)ship_obj.Get(Am_VISIBLE);

  ship_obj.Set(Am_VISIBLE, new_vis);
  hide_tractor_beams(ship_obj, new_vis);
  if (new_vis)
    SP_Ship_Agg.Add_Part(ship_obj);
  else
    SP_Ship_Agg.Remove_Part(ship_obj);
}